

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

ssize_t readn(int fd,string *inBuffer,bool *zero)

{
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  ssize_t sVar4;
  char buff [4096];
  long *local_1070;
  size_type local_1068;
  long local_1060 [2];
  long local_1050;
  bool *local_1048;
  string *local_1040;
  undefined1 local_1038 [4104];
  
  local_1050 = 3;
  local_1048 = zero;
  local_1040 = inBuffer;
  sVar2 = read(fd,local_1038,0x1000);
  if (sVar2 < 0) {
    piVar3 = __errno_location();
    uVar1 = 2;
    if (*piVar3 != 4) {
      if (*piVar3 == 0xb) {
        sVar4 = (*(code *)&LAB_0010e303)();
        return sVar4;
      }
      perror("read error");
      sVar4 = (*(code *)&LAB_0010e303)();
      return sVar4;
    }
  }
  else {
    if (sVar2 == 0) {
      *local_1048 = true;
      sVar4 = (*(code *)((long)&DAT_00111f68 + (long)(int)(&DAT_00111f68)[local_1050]))();
      return sVar4;
    }
    local_1070 = local_1060;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1070,local_1038,local_1038 + sVar2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (local_1040,(char *)local_1070,local_1068);
    if (local_1070 != local_1060) {
      operator_delete(local_1070,local_1060[0] + 1);
    }
    uVar1 = 0;
  }
  sVar4 = (*(code *)((long)&DAT_00111f68 + (long)(int)(&DAT_00111f68)[uVar1]))();
  return sVar4;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer, bool &zero){
    ssize_t nread=0;
    ssize_t readSum=0;

    while (true) {
        char buff[MAX_BUFF];
        if((nread=read(fd, buff, MAX_BUFF))<0){
            if(errno==EINTR){
                continue;;
            }else if (errno==EAGAIN) {
                return readSum;
            }else {
                perror("read error");
                return -1;
            }
        }else if (nread==0) {
            zero=true;
            break;
        }
        // printf("before inBuffer.size() = %d\n", inBuffer.size());
        // printf("nread = %d\n", nread);
        readSum+=nread;
        // buff += nread;
        inBuffer+=std::string(buff,buff+nread);
        // printf("after inBuffer.size() = %d\n", inBuffer.size());
    }
    return readSum;
}